

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Command * __thiscall
Catch::CommandParser::find(Command *__return_storage_ptr__,CommandParser *this,string *arg)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_41;
  string local_40;
  
  if (arg->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    getArgs(__return_storage_ptr__,this,&local_40,1);
LAB_0013341b:
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    for (uVar2 = 1; uVar2 < this->m_argc; uVar2 = uVar2 + 1) {
      bVar1 = std::operator==(this->m_argv[uVar2],arg);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,this->m_argv[uVar2],&local_41);
        getArgs(__return_storage_ptr__,this,&local_40,uVar2 + 1);
        goto LAB_0013341b;
      }
    }
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    (__return_storage_ptr__->m_name)._M_string_length = 0;
    (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Command find( const std::string& arg ) const {
            if( arg.empty() )
                return getArgs( "", 1 );
            else
                for( std::size_t i = 1; i < m_argc; ++i  )
                    if( m_argv[i] == arg )
                        return getArgs( m_argv[i], i+1 );
            return Command();
        }